

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DQuitMenu::HandleResult(DQuitMenu *this,bool res)

{
  bool bVar1;
  float volume;
  FSoundID local_18;
  undefined1 local_11;
  DQuitMenu *pDStack_10;
  bool res_local;
  DQuitMenu *this_local;
  
  local_11 = res;
  pDStack_10 = this;
  if (res) {
    if ((!netgame) && (bVar1 = FString::IsNotEmpty(&gameinfo.quitSound), bVar1)) {
      FSoundID::FSoundID(&local_18,&gameinfo.quitSound);
      volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_18,volume,0.0);
      I_WaitVBL(0x69);
    }
    ST_Endoom();
  }
  else {
    (*(this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject[0xd])();
    DMessageBoxMenu::CloseSound(&this->super_DMessageBoxMenu);
  }
  return;
}

Assistant:

void DQuitMenu::HandleResult(bool res)
{
	if (res)
	{
		if (!netgame)
		{
			if (gameinfo.quitSound.IsNotEmpty())
			{
				S_Sound (CHAN_VOICE | CHAN_UI, gameinfo.quitSound, snd_menuvolume, ATTN_NONE);
				I_WaitVBL (105);
			}
		}
		ST_Endoom();
	}
	else
	{
		Close();
		CloseSound();
	}
}